

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_conditional_expression_tree(FILE *out,AST_Conditional_Expression *cond)

{
  AST_Conditional_Expression *cond_local;
  FILE *out_local;
  
  fprintf((FILE *)out,"(");
  print_ast(out,cond->left);
  fprintf((FILE *)out,"?");
  print_ast(out,cond->center);
  fprintf((FILE *)out,":");
  print_ast(out,cond->right);
  fprintf((FILE *)out,")");
  return;
}

Assistant:

void print_conditional_expression_tree(FILE *out,struct AST_Conditional_Expression *cond)
{
	fprintf(out,"(");
	print_ast(out,cond->left);
	fprintf(out,"?");
	print_ast(out,cond->center);
	fprintf(out,":");
	print_ast(out,cond->right);
	fprintf(out,")");
}